

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

string * toml::detail::format_location_impl
                   (size_t lnw,string *prev_fname,source_location *loc,string *msg)

{
  __type_conflict _Var1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type sVar4;
  string *psVar5;
  size_type sVar6;
  size_t sVar7;
  unsigned_long *puVar8;
  string *msg_00;
  string *lnw_00;
  size_t linenum;
  const_reference this;
  allocator<char> *__a;
  source_location *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t first_underline_len_1;
  size_t first_underline_len;
  unsigned_long underline_len;
  size_t underline_limit;
  ostringstream oss;
  source_location *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  source_location *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc78;
  ostringstream *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  size_t in_stack_fffffffffffffc90;
  size_t in_stack_fffffffffffffc98;
  ostringstream *in_stack_fffffffffffffca0;
  ostringstream *oss_00;
  string *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd20;
  size_t in_stack_fffffffffffffd28;
  ostringstream *in_stack_fffffffffffffd30;
  allocator<char> local_271 [40];
  allocator<char> local_249 [40];
  ostringstream local_221 [33];
  size_t local_200;
  allocator<char> local_1f1 [33];
  long local_1d0;
  size_t local_1c8;
  unsigned_long local_1c0;
  unsigned_long local_1b8 [3];
  ostringstream local_1a0 [384];
  source_location *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  source_location::file_name_abi_cxx11_(local_20);
  _Var1 = std::operator==(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    format_filename((ostringstream *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    source_location::lines_abi_cxx11_(local_20);
    bVar2 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc30);
    if (!bVar2) {
      format_empty_line(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
  }
  pvVar3 = source_location::lines_abi_cxx11_(local_20);
  sVar4 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pvVar3);
  if (sVar4 == 1) {
    local_1b8[0] = 1;
    psVar5 = source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
    sVar7 = source_location::first_column_offset(local_20);
    if (sVar6 < sVar7) {
      local_1b8[0] = 1;
    }
    else {
      psVar5 = source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
      sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
      sVar7 = source_location::first_column_offset(local_20);
      local_1b8[0] = (sVar6 - sVar7) + 1;
    }
    local_1c8 = source_location::length(local_20);
    puVar8 = CLI::std::min<unsigned_long>(local_1b8,&local_1c8);
    local_1c0 = *puVar8;
    source_location::first_line_number(local_20);
    source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
    format_line(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                in_stack_fffffffffffffc88);
    source_location::first_column_offset(local_20);
    format_underline(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  }
  else {
    pvVar3 = source_location::lines_abi_cxx11_(local_20);
    sVar4 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pvVar3);
    if (sVar4 == 2) {
      psVar5 = source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
      msg_00 = (string *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
      sVar7 = source_location::first_column_offset(local_20);
      local_1d0 = (long)msg_00 + (1 - sVar7);
      sVar7 = source_location::first_line_number(local_20);
      lnw_00 = source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
      format_line(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                  in_stack_fffffffffffffc88);
      source_location::first_column_offset(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      format_underline((ostringstream *)psVar5,(size_t)lnw_00,sVar7,(size_t)local_10,msg_00);
      std::__cxx11::string::~string(in_stack_fffffffffffffc20);
      std::allocator<char>::~allocator(local_1f1);
      source_location::last_line_number(local_20);
      source_location::last_line_abi_cxx11_(in_stack_fffffffffffffc30);
      format_line(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                  in_stack_fffffffffffffc88);
      source_location::last_column_offset(local_20);
      format_underline((ostringstream *)psVar5,(size_t)lnw_00,sVar7,(size_t)local_10,msg_00);
    }
    else {
      pvVar3 = source_location::lines_abi_cxx11_(local_20);
      sVar4 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pvVar3);
      if (2 < sVar4) {
        psVar5 = source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
        sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
        sVar7 = source_location::first_column_offset(local_20);
        local_200 = (sVar6 - sVar7) + 1;
        source_location::first_line_number(local_20);
        source_location::first_line_abi_cxx11_(in_stack_fffffffffffffc30);
        format_line(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                    in_stack_fffffffffffffc88);
        line = local_10;
        linenum = source_location::first_column_offset(local_20);
        oss_00 = local_221;
        sVar7 = local_200;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        format_underline(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                         in_stack_fffffffffffffd10);
        std::__cxx11::string::~string(in_stack_fffffffffffffc20);
        std::allocator<char>::~allocator((allocator<char> *)local_221);
        pvVar3 = source_location::lines_abi_cxx11_(local_20);
        sVar4 = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pvVar3);
        if (sVar4 == 3) {
          source_location::first_line_number(local_20);
          source_location::lines_abi_cxx11_(local_20);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc20,(size_type)in_stack_fffffffffffffc18);
          format_line(oss_00,sVar7,linenum,(string *)line);
          source_location::lines_abi_cxx11_(local_20);
          this = CLI::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc20,(size_type)in_stack_fffffffffffffc18);
          __a = (allocator<char> *)
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(this);
          __s = local_249;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_10,(char *)__s,__a);
          format_underline(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                           in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                           in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(in_stack_fffffffffffffc20);
          std::allocator<char>::~allocator(local_249);
        }
        else {
          source_location::first_line_number(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
          format_line(oss_00,sVar7,linenum,(string *)line);
          std::__cxx11::string::~string(in_stack_fffffffffffffc20);
          std::allocator<char>::~allocator(local_271);
          format_empty_line(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        }
        source_location::last_line_number(local_20);
        source_location::last_line_abi_cxx11_(in_stack_fffffffffffffc30);
        format_line(oss_00,sVar7,linenum,(string *)line);
        source_location::last_column_offset(local_20);
        format_underline(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                         in_stack_fffffffffffffd10);
      }
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string format_location_impl(const std::size_t lnw,
    const std::string& prev_fname,
    const source_location& loc, const std::string& msg)
{
    std::ostringstream oss;

    if(loc.file_name() != prev_fname)
    {
        format_filename(oss, loc);
        if( ! loc.lines().empty())
        {
            format_empty_line(oss, lnw);
        }
    }

    if(loc.lines().size() == 1)
    {
        // when column points LF, it exceeds the size of the first line.
        std::size_t underline_limit = 1;
        if(loc.first_line().size() < loc.first_column_offset())
        {
            underline_limit = 1;
        }
        else
        {
            underline_limit = loc.first_line().size() - loc.first_column_offset() + 1;
        }
        const auto underline_len = (std::min)(underline_limit, loc.length());

        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(), underline_len, msg);
    }
    else if(loc.lines().size() == 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "");

        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    else if(loc.lines().size() > 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "and");

        if(loc.lines().size() == 3)
        {
            format_line(oss, lnw, loc.first_line_number()+1, loc.lines().at(1));
            format_underline(oss, lnw, 1, loc.lines().at(1).size(), "and");
        }
        else
        {
            format_line(oss, lnw, loc.first_line_number()+1, " ...");
            format_empty_line(oss, lnw);
        }
        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    // if loc is empty, do nothing.
    return oss.str();
}